

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper.c
# Opt level: O0

void helper_crypto_sha256su0_arm(void *vd,void *vm)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  undefined4 local_48;
  CRYPTO_STATE m;
  CRYPTO_STATE d;
  uint64_t *rm;
  uint64_t *rd;
  void *vm_local;
  void *vd_local;
  
  uVar1 = *vd;
  uVar2 = *(undefined8 *)((long)vd + 8);
  uVar3 = *vm;
  m.words[3] = (uint32_t)((ulong)uVar1 >> 0x20);
  uVar4 = s0(m.words[3]);
  m.words[2] = (uint32_t)uVar1;
  d.words[0] = (uint32_t)uVar2;
  uVar5 = s0(d.words[0]);
  m.words[3] = uVar5 + m.words[3];
  m.words[2] = uVar4 + m.words[2];
  d.words[1] = (uint32_t)((ulong)uVar2 >> 0x20);
  uVar4 = s0(d.words[1]);
  local_48 = (uint32_t)uVar3;
  uVar5 = s0(local_48);
  d.words[1] = uVar5 + d.words[1];
  d.words[0] = uVar4 + d.words[0];
  *(uint64_t *)vd = m.l[1];
  *(uint64_t *)((long)vd + 8) = d.l[0];
  return;
}

Assistant:

void HELPER(crypto_sha256su0)(void *vd, void *vm)
{
    uint64_t *rd = vd;
    uint64_t *rm = vm;
    union CRYPTO_STATE d = { .l = { rd[0], rd[1] } };
    union CRYPTO_STATE m = { .l = { rm[0], rm[1] } };

    CR_ST_WORD(d, 0) += s0(CR_ST_WORD(d, 1));
    CR_ST_WORD(d, 1) += s0(CR_ST_WORD(d, 2));
    CR_ST_WORD(d, 2) += s0(CR_ST_WORD(d, 3));
    CR_ST_WORD(d, 3) += s0(CR_ST_WORD(m, 0));

    rd[0] = d.l[0];
    rd[1] = d.l[1];
}